

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall Object::visualizeEdges(Object *this,Mat *src,Point *obs)

{
  double dVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  size_type sVar5;
  CoeffReturnType pdVar6;
  Point_<int> *in_RDX;
  long in_RDI;
  char str [8];
  size_t i;
  Edge *eg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Edge,_std::allocator<Edge>_> *__range1;
  int cnt;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  Point_<int> *in_stack_fffffffffffffd80;
  Point_<int> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  allocator<char> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined1 local_1e0 [32];
  Point_<int> local_1c0;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [32];
  Point_<int> local_180;
  undefined1 local_178 [24];
  undefined1 local_160 [32];
  Point_<int> local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [36];
  Point_<int> local_fc;
  Point_<int> local_f4;
  undefined1 local_ec [11];
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [24];
  char local_a8 [8];
  undefined1 local_a0 [36];
  Point_<int> local_7c [2];
  Point_<int> local_68;
  undefined1 local_60 [24];
  ulong local_48;
  reference local_40;
  Edge *local_38;
  __normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> local_30;
  long local_28;
  uint local_1c;
  
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_1c = 0xffffffff;
    local_28 = in_RDI + 0x10;
    local_30._M_current =
         (Edge *)std::vector<Edge,_std::allocator<Edge>_>::begin
                           ((vector<Edge,_std::allocator<Edge>_> *)
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_38 = (Edge *)std::vector<Edge,_std::allocator<Edge>_>::end
                                 ((vector<Edge,_std::allocator<Edge>_> *)
                                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                              (__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)),
          bVar4) {
      local_40 = __gnu_cxx::
                 __normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
                 operator*(&local_30);
      local_1c = local_1c + 1;
      if ((local_40->valid & 1U) != 0) {
        for (local_48 = 1; uVar2 = local_48,
            sVar5 = std::
                    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)0x14bb29), uVar3 = local_1c, uVar2 < sVar5; local_48 = local_48 + 1) {
          cv::_InputOutputArray::_InputOutputArray
                    ((_InputOutputArray *)in_stack_fffffffffffffd80,
                     (Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bb72);
          dVar1 = *pdVar6;
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bbaf);
          cv::Point_<int>::Point_(&local_68,(int)dVar1,(int)*pdVar6);
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bbf8);
          dVar1 = *pdVar6;
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::operator[]((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bc2f);
          cv::Point_<int>::Point_(local_7c,(int)dVar1,(int)*pdVar6);
          cv::Scalar_<double>::Scalar_
                    ((Scalar_<double> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     (double)in_stack_fffffffffffffd88,(double)in_stack_fffffffffffffd80,
                     (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     (double)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          in_stack_fffffffffffffd68 = 0;
          cv::line(local_60,&local_68,local_7c,local_a0,3,8);
          cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x14bcbb);
        }
        sVar5 = std::
                deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)0x14bd12);
        snprintf(local_a8,8,"%d:%lu",(ulong)uVar3,sVar5);
        cv::_InputOutputArray::_InputOutputArray
                  ((_InputOutputArray *)in_stack_fffffffffffffd80,
                   (Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,
                   (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda0);
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffd80);
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bd8e);
        in_stack_fffffffffffffdac = (int)*pdVar6;
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffdb0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bdb7);
        cv::Point_<int>::Point_
                  (&local_f4,in_stack_fffffffffffffdac,(int)*(double *)in_stack_fffffffffffffdb0);
        cv::Point_<int>::Point_(&local_fc,10,10);
        cv::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        cv::Scalar_<double>::Scalar_
                  ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (double)in_stack_fffffffffffffd88,(double)in_stack_fffffffffffffd80,
                   (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (double)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        in_stack_fffffffffffffd70 = 0;
        cv::putText(0x3ff0000000000000,local_c0,local_e0,local_ec,1,local_120,1,8);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator(&local_e1);
        cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x14be9e);
        cv::_InputOutputArray::_InputOutputArray
                  ((_InputOutputArray *)in_stack_fffffffffffffd80,
                   (Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffda0 =
             (allocator<char> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bec8);
        in_stack_fffffffffffffd94 = (int)*(double *)in_stack_fffffffffffffda0;
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffd80);
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bef1);
        cv::Point_<int>::Point_(&local_140,in_stack_fffffffffffffd94,(int)*pdVar6);
        cv::Scalar_<double>::Scalar_
                  ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (double)in_stack_fffffffffffffd88,(double)in_stack_fffffffffffffd80,
                   (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (double)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        cv::circle(local_138,&local_140,3,local_160,0xffffffff,8,0);
        cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x14bf7a);
        cv::_InputOutputArray::_InputOutputArray
                  ((_InputOutputArray *)in_stack_fffffffffffffd80,
                   (Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd88 =
             (Point_<int> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bfa4);
        in_stack_fffffffffffffd7c = (int)(double)*in_stack_fffffffffffffd88;
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd80 =
             (Point_<int> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)0x14bfcd);
        cv::Point_<int>::Point_
                  (&local_180,in_stack_fffffffffffffd7c,(int)(double)*in_stack_fffffffffffffd80);
        cv::Scalar_<double>::Scalar_
                  ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (double)in_stack_fffffffffffffd88,(double)in_stack_fffffffffffffd80,
                   (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (double)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        in_stack_fffffffffffffd68 = 0;
        cv::circle(local_178,&local_180,3,local_1a0,0xffffffff,8);
        cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x14c056);
      }
      __gnu_cxx::__normal_iterator<const_Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
      operator++(&local_30);
    }
    cv::_InputOutputArray::_InputOutputArray
              ((_InputOutputArray *)in_stack_fffffffffffffd80,
               (Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    cv::Point_<int>::Point_(&local_1c0,in_RDX);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (double)in_stack_fffffffffffffd88,(double)in_stack_fffffffffffffd80,
               (double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               (double)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    cv::circle(local_1b8,&local_1c0,4,local_1e0,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x14c19c);
  }
  return;
}

Assistant:

void Object::visualizeEdges(cv::Mat& src, cv::Point obs) const{
    if (valid == false)
        return;
    int cnt = -1;
    for (const Edge& eg: edges) {
        cnt++;
        if (eg.valid == false) continue;
        for (size_t i = 1; i < eg.size(); i++) {
            cv::line(src, cv::Point(eg[i - 1].x(), eg[i - 1].y()), cv::Point(eg[i].x(), eg[i].y()), cv::Scalar(0, 255, 255), 3);
        }
        char str[8];
        snprintf(str, 8, "%d:%lu", cnt, eg.size());
		cv::putText(src, str, cv::Point(eg.front().x(), eg.front().y()) + cv::Point(10, 10),
					cv::FONT_HERSHEY_PLAIN, 1, cv::Scalar(0, 255, 0));
        cv::circle(src, cv::Point(eg.front().x(), eg.front().y()), 3, cv::Scalar(255, 255, 0), -1);
        cv::circle(src, cv::Point(eg.back().x(), eg.back().y()), 3, cv::Scalar(255, 0, 255), -1);
    }
    cv::circle(src, obs, 4, cv::Scalar(0, 255, 0), -1);
}